

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat __thiscall Mat::DirectProduct(Mat *this,Mat *rhs)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  uint *in_RDX;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  ulong uVar18;
  long lVar19;
  Mat MVar20;
  
  Mat(this,*in_RDX * rhs->n_rows_,in_RDX[1] * rhs->n_cols_);
  uVar1 = rhs->n_cols_;
  pdVar5 = this->v_;
  iVar2 = this->n_cols_;
  pdVar11 = (double *)0x0;
  uVar14 = 0;
  if (0 < (int)uVar1) {
    uVar14 = (ulong)uVar1;
  }
  pdVar8 = (double *)(ulong)(uint)rhs->n_rows_;
  if (rhs->n_rows_ < 1) {
    pdVar8 = pdVar11;
  }
  for (pdVar17 = (double *)0x0; pdVar17 != pdVar8; pdVar17 = (double *)((long)pdVar17 + 1)) {
    uVar3 = *in_RDX;
    uVar18 = 0;
    if (0 < (int)uVar3) {
      uVar18 = (ulong)uVar3;
    }
    lVar10 = 0;
    for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
      uVar4 = in_RDX[1];
      uVar12 = 0;
      if (0 < (int)uVar4) {
        uVar12 = (ulong)uVar4;
      }
      lVar19 = (long)pdVar5 + lVar10 * (int)uVar4 + (long)(int)uVar3 * (long)pdVar11;
      lVar9 = 0;
      for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
        pdVar6 = rhs->v_;
        lVar7 = *(long *)(in_RDX + 2);
        for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
          *(double *)(lVar19 + uVar16 * 8) =
               pdVar6[(long)pdVar17 * (long)(int)uVar1 + uVar13] *
               *(double *)(lVar7 + lVar9 + uVar16 * 8);
        }
        lVar19 = lVar19 + (long)iVar2 * 8;
        lVar9 = lVar9 + (long)(int)uVar4 * 8;
      }
      lVar10 = lVar10 + 8;
    }
    pdVar11 = pdVar11 + iVar2;
  }
  MVar20.v_ = pdVar11;
  MVar20._0_8_ = this;
  return MVar20;
}

Assistant:

Mat Mat::DirectProduct(const Mat &rhs) const
{
	Mat product(n_rows_*rhs.n_rows_, n_cols_*rhs.n_cols_);
	for (int im = 0; im < n_rows_ ; im++ )
	{
		for (int jm=0; jm<n_cols_; jm++)
		{
			for (int in=0; in<rhs.n_rows_ ; in++ )
			{
				for (int jn=0; jn<rhs.n_cols_; jn++)
				{
					int m = im*rhs.n_rows_ +in;
					int n = jm*rhs.n_cols_+ jn;
					product( m , n) = v_[im*n_cols_+jm] *  rhs.v_[in*rhs.n_cols_+jn];
				}
			}
		} 
	}
	return product;
}